

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O0

ChStreamOutAscii * chrono::operator<<(ChStreamOutAscii *mstream,myEmployeeCustomConstructor **obj)

{
  char *mf;
  vector<char,_std::allocator<char>_> *pvVar1;
  ChStreamOutAscii *pCVar2;
  char in_R9B;
  allocator<char> local_1d9;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1d8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1d0;
  string local_1c8 [8];
  string mystring;
  undefined1 local_190 [8];
  ChArchiveAsciiDump marchive;
  undefined1 local_68 [8];
  ChStreamOutAsciiVector mtempstream;
  vector<char,_std::allocator<char>_> mvect;
  myEmployeeCustomConstructor **obj_local;
  ChStreamOutAscii *mstream_local;
  
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&mtempstream.field_0x30);
  ChStreamOutAsciiVector::ChStreamOutAsciiVector
            ((ChStreamOutAsciiVector *)local_68,
             (vector<char,_std::allocator<char>_> *)&mtempstream.field_0x30);
  mf = ChStreamOutAscii::GetNumFormat(mstream);
  ChStreamOutAscii::SetNumFormat((ChStreamOutAscii *)&mtempstream.field_0x10,mf);
  ChArchiveAsciiDump::ChArchiveAsciiDump
            ((ChArchiveAsciiDump *)local_190,(ChStreamOutAscii *)&mtempstream.field_0x10);
  ChArchiveOut::SetCutAllPointers((ChArchiveOut *)local_190,true);
  ChArchiveAsciiDump::SetSuppressNames((ChArchiveAsciiDump *)local_190,true);
  ChArchive::SetUseVersions((ChArchive *)local_190,false);
  make_ChNameValue<myEmployeeCustomConstructor*>
            ((ChNameValue<myEmployeeCustomConstructor_*> *)((long)&mystring.field_2 + 8),
             (chrono *)"obj",(char *)obj,(myEmployeeCustomConstructor **)0x19db55,(char *)0x0,in_R9B
            );
  ChArchiveOut::operator<<
            ((ChArchiveOut *)local_190,
             (ChNameValue<myEmployeeCustomConstructor_*> *)((long)&mystring.field_2 + 8));
  ChNameValue<myEmployeeCustomConstructor_*>::~ChNameValue
            ((ChNameValue<myEmployeeCustomConstructor_*> *)((long)&mystring.field_2 + 8));
  pvVar1 = ChStreamVectorWrapper::GetVector((ChStreamVectorWrapper *)local_68);
  local_1d0._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(pvVar1);
  pvVar1 = ChStreamVectorWrapper::GetVector((ChStreamVectorWrapper *)local_68);
  local_1d8._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(pvVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            (local_1c8,local_1d0,local_1d8,&local_1d9);
  std::allocator<char>::~allocator(&local_1d9);
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(mstream,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  ChArchiveAsciiDump::~ChArchiveAsciiDump((ChArchiveAsciiDump *)local_190);
  ChStreamOutAsciiVector::~ChStreamOutAsciiVector((ChStreamOutAsciiVector *)local_68);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)&mtempstream.field_0x30);
  return pCVar2;
}

Assistant:

ChStreamOutAscii & operator<<(ChStreamOutAscii &mstream, const T& obj) {
    std::vector<char> mvect;
    ChStreamOutAsciiVector mtempstream(&mvect);
    mtempstream.SetNumFormat(mstream.GetNumFormat());
    ChArchiveAsciiDump marchive(mtempstream);
    // this avoids printing too much except the object:
    marchive.SetCutAllPointers(true);
    marchive.SetSuppressNames(true);
    marchive.SetUseVersions(false);
    marchive << CHNVP(obj,"");
    std::string mystring(mtempstream.GetVector()->begin(),mtempstream.GetVector()->end());
    return mstream << mystring;
}